

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMLSParserImpl::docComment(DOMLSParserImpl *this,XMLCh *comment)

{
  ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *this_00;
  DOMNode *key;
  int iVar1;
  ValueHashTableBucketElem<bool> *pVVar2;
  XMLSize_t hashVal;
  XMLSize_t XStack_18;
  
  if ((this->fFilter != (DOMLSParserFilter *)0x0) &&
     (this_00 = this->fFilterDelayedTextNodes,
     this_00 != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) {
    key = (this->super_AbstractDOMParser).fCurrentNode;
    for (pVVar2 = this_00->fBucketList[(ulong)key % this_00->fHashModulus];
        pVVar2 != (ValueHashTableBucketElem<bool> *)0x0; pVVar2 = pVVar2->fNext) {
      if ((DOMNode *)pVVar2->fKey == key) {
        ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeBucketElem(this_00,key,&XStack_18);
        applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
        break;
      }
    }
  }
  AbstractDOMParser::docComment(&this->super_AbstractDOMParser,comment);
  if (this->fFilter != (DOMLSParserFilter *)0x0) {
    iVar1 = (*this->fFilter->_vptr_DOMLSParserFilter[4])();
    if ((char)iVar1 < '\0') {
      applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
    }
  }
  return;
}

Assistant:

void DOMLSParserImpl::docComment(const XMLCh* const  comment)
{
    if(fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    AbstractDOMParser::docComment(comment);
    if(fFilter)
    {
        DOMNodeFilter::ShowType whatToShow=fFilter->getWhatToShow();
        if(whatToShow & DOMNodeFilter::SHOW_COMMENT)
            applyFilter(fCurrentNode);
    }
}